

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void prvTidyList2BQ(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  
  if (node != (Node *)0x0) {
    do {
      if (node->content != (Node *)0x0) {
        prvTidyList2BQ(doc,node->content);
      }
      if ((((node->tag != (Dict *)0x0) && (node->tag->parser == prvTidyParseList)) &&
          (pNVar1 = node->content, pNVar1 != (Node *)0x0)) &&
         ((pNVar1->next == (Node *)0x0 && (pNVar1->implicit != no)))) {
        StripOnlyChild(doc,node);
        RenameElem(doc,node,TidyTag_BLOCKQUOTE);
        node->implicit = yes;
      }
      node = node->next;
    } while (node != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(List2BQ)( TidyDocImpl* doc, Node* node )
{
    while (node)
    {
        if (node->content)
            TY_(List2BQ)( doc, node->content );

        if ( node->tag && node->tag->parser == TY_(ParseList) &&
             HasOneChild(node) && node->content->implicit )
        {
            StripOnlyChild( doc, node );
            RenameElem( doc, node, TidyTag_BLOCKQUOTE );
            node->implicit = yes;
        }

        node = node->next;
    }
}